

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

PoolItem * __thiscall soul::PoolAllocator::allocateSpaceForObject(PoolAllocator *this,size_t size)

{
  bool bVar1;
  PoolItem *pPVar2;
  size_t size_local;
  PoolAllocator *this_local;
  
  bVar1 = Pool::hasSpaceFor(this->currentPool,size);
  if (!bVar1) {
    addNewPool(this);
    bVar1 = Pool::hasSpaceFor(this->currentPool,size);
    checkAssertion(bVar1,"currentPool->hasSpaceFor (size)","allocateSpaceForObject",0x14b);
  }
  pPVar2 = Pool::createItem(this->currentPool,size);
  return pPVar2;
}

Assistant:

PoolItem& allocateSpaceForObject (size_t size)
    {
        if (! currentPool->hasSpaceFor (size))
        {
            addNewPool();
            SOUL_ASSERT (currentPool->hasSpaceFor (size));
        }

        return currentPool->createItem (size);
    }